

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

int * __thiscall
TMap<int,_int,_THashTraits<int>,_InitIntToZero>::Insert
          (TMap<int,_int,_THashTraits<int>,_InitIntToZero> *this,int key,int *value)

{
  Node *pNVar1;
  
  pNVar1 = FindKey(this,key);
  if (pNVar1 == (Node *)0x0) {
    pNVar1 = NewKey(this,key);
  }
  (pNVar1->Pair).Value = *value;
  return &(pNVar1->Pair).Value;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}